

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O2

void __thiscall
RemovedMempoolTransactionInfo::RemovedMempoolTransactionInfo
          (RemovedMempoolTransactionInfo *this,CTxMemPoolEntry *entry)

{
  int32_t iVar1;
  long in_FS_OFFSET;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)entry);
  iVar1 = CTxMemPoolEntry::GetTxSize(entry);
  TransactionInfo::TransactionInfo
            (&this->info,(CTransactionRef *)&_Stack_28,&entry->nFee,(long)iVar1,entry->entryHeight);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit RemovedMempoolTransactionInfo(const CTxMemPoolEntry& entry)
        : info{entry.GetSharedTx(), entry.GetFee(), entry.GetTxSize(), entry.GetHeight()} {}